

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O0

void strpool_defrag(strpool_t *pool)

{
  int iVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  strpool_internal_hash_slot_t *__s;
  char *pcVar5;
  strpool_internal_entry_t *psVar6;
  strpool_internal_entry_t *psVar7;
  strpool_internal_entry_t *psVar8;
  strpool_internal_block_t *psVar9;
  uint local_90;
  uint local_8c;
  uint local_84;
  int local_80;
  uint local_7c;
  int i_2;
  int slot;
  int base_slot;
  uint hash;
  strpool_internal_entry_t *entry_1;
  char *pcStack_60;
  int i_1;
  char *tail;
  int index;
  strpool_internal_entry_t *entries;
  int capacity;
  char *data;
  strpool_internal_hash_slot_t *hash_table;
  int hash_capacity;
  int data_capacity;
  strpool_internal_entry_t *entry;
  uint local_18;
  int i;
  int count;
  int data_size;
  strpool_t *pool_local;
  
  i = 0;
  local_18 = 0;
  for (entry._4_4_ = 0; entry._4_4_ < pool->entry_count; entry._4_4_ = entry._4_4_ + 1) {
    if (0 < pool->entries[entry._4_4_].refcount) {
      i = pool->entries[entry._4_4_].size + i;
      local_18 = local_18 + 1;
    }
  }
  if (i < pool->block_size) {
    local_84 = pool->block_size;
  }
  else {
    local_84 = strpool_internal_pow2ceil(i);
  }
  uVar3 = local_18 + (int)local_18 / 2;
  if (SBORROW4(uVar3,pool->initial_entry_capacity * 2) ==
      (int)(uVar3 + pool->initial_entry_capacity * -2) < 0) {
    local_8c = strpool_internal_pow2ceil(uVar3);
  }
  else {
    local_8c = pool->initial_entry_capacity << 1;
  }
  __s = (strpool_internal_hash_slot_t *)
        sx__malloc((sx_alloc *)pool->memctx,(long)(int)local_8c * 0xc,0,(char *)0x0,(char *)0x0,0);
  if (__s == (strpool_internal_hash_slot_t *)0x0) {
    __assert_fail("hash_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                  ,0x29e,"void strpool_defrag(strpool_t *)");
  }
  memset(__s,0,(long)(int)local_8c * 0xc);
  pcVar5 = (char *)sx__malloc((sx_alloc *)pool->memctx,(long)(int)local_84,0,(char *)0x0,(char *)0x0
                              ,0);
  if (pcVar5 == (char *)0x0) {
    __assert_fail("data",
                  "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                  ,0x2a2,"void strpool_defrag(strpool_t *)");
  }
  if ((int)local_18 < pool->initial_entry_capacity) {
    local_90 = pool->initial_entry_capacity;
  }
  else {
    local_90 = strpool_internal_pow2ceil(local_18);
  }
  psVar6 = (strpool_internal_entry_t *)
           sx__malloc((sx_alloc *)pool->memctx,(long)(int)local_90 << 5,0,(char *)0x0,(char *)0x0,0)
  ;
  if (psVar6 == (strpool_internal_entry_t *)0x0) {
    __assert_fail("entries",
                  "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                  ,0x2a7,"void strpool_defrag(strpool_t *)");
  }
  tail._4_4_ = 0;
  entry_1._4_4_ = 0;
  pcStack_60 = pcVar5;
  do {
    if (pool->entry_count <= entry_1._4_4_) {
      sx__free((sx_alloc *)pool->memctx,pool->hash_table,0,(char *)0x0,(char *)0x0,0);
      sx__free((sx_alloc *)pool->memctx,pool->entries,0,(char *)0x0,(char *)0x0,0);
      for (local_80 = 0; local_80 < pool->block_count; local_80 = local_80 + 1) {
        sx__free((sx_alloc *)pool->memctx,pool->blocks[local_80].data,0,(char *)0x0,(char *)0x0,0);
      }
      if (pool->block_capacity != pool->initial_block_capacity) {
        sx__free((sx_alloc *)pool->memctx,pool->blocks,0,(char *)0x0,(char *)0x0,0);
        psVar9 = (strpool_internal_block_t *)
                 sx__malloc((sx_alloc *)pool->memctx,(long)pool->initial_block_capacity << 5,0,
                            (char *)0x0,(char *)0x0,0);
        pool->blocks = psVar9;
        if (pool->blocks == (strpool_internal_block_t *)0x0) {
          __assert_fail("pool->blocks",
                        "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                        ,0x2cf,"void strpool_defrag(strpool_t *)");
        }
      }
      pool->block_capacity = pool->initial_block_capacity;
      pool->block_count = 1;
      pool->current_block = 0;
      pool->blocks->capacity = local_84;
      pool->blocks->data = pcVar5;
      pool->blocks->tail = pcStack_60;
      pool->blocks->free_list = -1;
      pool->hash_table = __s;
      pool->hash_capacity = local_8c;
      pool->entries = psVar6;
      pool->entry_capacity = local_90;
      pool->entry_count = local_18;
      return;
    }
    psVar7 = pool->entries + entry_1._4_4_;
    if (0 < psVar7->refcount) {
      psVar8 = psVar6 + tail._4_4_;
      iVar1 = psVar7->handle_index;
      psVar8->hash_slot = psVar7->hash_slot;
      psVar8->handle_index = iVar1;
      psVar8->data = psVar7->data;
      iVar1 = psVar7->length;
      psVar8->size = psVar7->size;
      psVar8->length = iVar1;
      uVar2 = *(undefined4 *)&psVar7->field_0x1c;
      psVar8->refcount = psVar7->refcount;
      *(undefined4 *)&psVar8->field_0x1c = uVar2;
      uVar3 = pool->hash_table[psVar7->hash_slot].hash_key;
      uVar4 = uVar3 & local_8c - 1;
      local_7c = uVar4;
      while (__s[(int)local_7c].hash_key != 0) {
        local_7c = local_7c + 1 & local_8c - 1;
      }
      if (uVar3 == 0) {
        __assert_fail("hash",
                      "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                      ,0x2b6,"void strpool_defrag(strpool_t *)");
      }
      __s[(int)local_7c].hash_key = uVar3;
      __s[(int)local_7c].entry_index = tail._4_4_;
      __s[(int)uVar4].base_count = __s[(int)uVar4].base_count + 1;
      psVar6[tail._4_4_].hash_slot = local_7c;
      psVar6[tail._4_4_].data = pcStack_60;
      psVar6[tail._4_4_].handle_index = psVar7->handle_index;
      pool->handles[psVar7->handle_index].entry_index = tail._4_4_;
      memcpy(pcStack_60,psVar7->data,(long)(psVar7->length + 1) + 8);
      pcStack_60 = pcStack_60 + psVar7->size;
      tail._4_4_ = tail._4_4_ + 1;
    }
    entry_1._4_4_ = entry_1._4_4_ + 1;
  } while( true );
}

Assistant:

void strpool_defrag( strpool_t* pool )
    {
    int data_size = 0;
    int count = 0;
    for( int i = 0; i < pool->entry_count; ++i )
        {
        strpool_internal_entry_t* entry = &pool->entries[ i ];
        if( entry->refcount > 0 )
            {
            data_size += entry->size;
            ++count;
            }
        }

    int data_capacity = data_size < pool->block_size ? 
        pool->block_size : (int)strpool_internal_pow2ceil( (STRPOOL_U32)data_size );

    int hash_capacity = count + count / 2;
    hash_capacity = hash_capacity < ( pool->initial_entry_capacity * 2 ) ? 
        ( pool->initial_entry_capacity * 2 ) : (int)strpool_internal_pow2ceil( (STRPOOL_U32)hash_capacity );
    strpool_internal_hash_slot_t* hash_table = (strpool_internal_hash_slot_t*) STRPOOL_MALLOC( pool->memctx, 
        hash_capacity * sizeof( *hash_table ) );
    STRPOOL_ASSERT( hash_table );
    STRPOOL_MEMSET( hash_table, 0, hash_capacity * sizeof( *hash_table ) );

    char* data = (char*) STRPOOL_MALLOC( pool->memctx, (size_t) data_capacity );
    STRPOOL_ASSERT( data );
    int capacity = count < pool->initial_entry_capacity ? 
        pool->initial_entry_capacity : (int)strpool_internal_pow2ceil( (STRPOOL_U32)count );
    strpool_internal_entry_t* entries = (strpool_internal_entry_t*) STRPOOL_MALLOC( pool->memctx, 
        capacity * sizeof( *entries ) );
    STRPOOL_ASSERT( entries );
    int index = 0;
    char* tail = data;
    for( int i = 0; i < pool->entry_count; ++i )
        {
        strpool_internal_entry_t* entry = &pool->entries[ i ];
        if( entry->refcount > 0 )
            {
            entries[ index ] = *entry;

            STRPOOL_U32 hash = pool->hash_table[ entry->hash_slot ].hash_key;
            int base_slot = (int)( hash & (STRPOOL_U32)( hash_capacity - 1 ) );
            int slot = base_slot;
            while( hash_table[ slot ].hash_key )
                slot = (slot + 1 ) & ( hash_capacity - 1 );
            STRPOOL_ASSERT( hash );
            hash_table[ slot ].hash_key = hash;
            hash_table[ slot ].entry_index = index;
            ++hash_table[ base_slot ].base_count;

            entries[ index ].hash_slot = slot;
            entries[ index ].data = tail;
            entries[ index ].handle_index = entry->handle_index;
            pool->handles[ entry->handle_index ].entry_index = index;
            STRPOOL_MEMCPY( tail, entry->data, entry->length + 1 + 2 * sizeof( STRPOOL_U32 ) );
            tail += entry->size;
            ++index;
            }
        }


    STRPOOL_FREE( pool->memctx, pool->hash_table );
    STRPOOL_FREE( pool->memctx, pool->entries );
    for( int i = 0; i < pool->block_count; ++i ) STRPOOL_FREE( pool->memctx, pool->blocks[ i ].data );

    if( pool->block_capacity != pool->initial_block_capacity )
        {
        STRPOOL_FREE( pool->memctx, pool->blocks );
        pool->blocks = (strpool_internal_block_t*) STRPOOL_MALLOC( pool->memctx, 
            pool->initial_block_capacity * sizeof( *pool->blocks ) );
        STRPOOL_ASSERT( pool->blocks );
        }
    pool->block_capacity = pool->initial_block_capacity;
    pool->block_count = 1;
    pool->current_block = 0;
    pool->blocks[ 0 ].capacity = data_capacity;
    pool->blocks[ 0 ].data = data;
    pool->blocks[ 0 ].tail = tail;
    pool->blocks[ 0 ].free_list = -1;
    
    pool->hash_table = hash_table;
    pool->hash_capacity = hash_capacity;

    pool->entries = entries;
    pool->entry_capacity = capacity;
    pool->entry_count = count;
    }